

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O3

int PAL_vsscanf(LPCSTR Buffer,LPCSTR Format,__va_list_tag *ap)

{
  byte bVar1;
  undefined8 uVar2;
  LPWSTR lpWideCharStr;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  FILE *__stream;
  byte *pbVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  errno_t eVar12;
  uint uVar13;
  DWORD DVar14;
  size_t sVar15;
  byte *__nptr;
  long lVar16;
  undefined8 *puVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  byte *pbVar21;
  byte *pbVar22;
  byte *pbVar23;
  ulong uVar24;
  long in_FS_OFFSET;
  int local_468;
  int local_448;
  byte local_441;
  int n;
  uint local_43c;
  byte local_438;
  byte local_437 [7];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  bVar8 = *Format;
  if (bVar8 == 0) {
    iVar10 = 0;
LAB_003145ec:
    if (*(long *)(in_FS_OFFSET + 0x28) != TempBuff._1016_8_) {
      __stack_chk_fail();
    }
    return iVar10;
  }
  iVar10 = 0;
  local_43c = 0xffffffff;
  pbVar22 = (byte *)Buffer;
LAB_003138f8:
  if ((*pbVar22 == 0) && (iVar10 == 0)) goto LAB_003145e6;
  iVar9 = isspace((uint)bVar8);
  if (iVar9 != 0) {
    pbVar23 = pbVar22 + -1;
    do {
      pbVar22 = pbVar23 + 1;
      pbVar23 = pbVar23 + 1;
      iVar9 = isspace((uint)*pbVar22);
    } while (iVar9 != 0);
    Format = (LPCSTR)((byte *)Format + 1);
    goto LAB_00314509;
  }
  if (*Format != 0x25) goto LAB_003144e6;
  pbVar23 = (byte *)Format + 1;
  local_438 = 0x25;
  sVar15 = strlen((char *)pbVar23);
  __nptr = (byte *)PAL_malloc(sVar15 + 1);
  if (__nptr == (byte *)0x0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00314610;
    local_43c = 0xffffffff;
    DVar14 = 8;
    Format = (LPCSTR)pbVar23;
LAB_00313c1d:
    SetLastError(DVar14);
    goto LAB_003144e6;
  }
  local_441 = *pbVar23;
  pbVar21 = local_437;
  bVar8 = local_441;
  if (local_441 == 0x2a) {
    local_437[0] = 0x2a;
    bVar8 = ((byte *)Format)[2];
    pbVar21 = local_437 + 1;
    pbVar23 = (byte *)Format + 2;
  }
  Format = (LPCSTR)pbVar23;
  n = iVar10;
  iVar10 = isdigit((uint)bVar8);
  uVar13 = 0xffffffff;
  if (iVar10 == 0) {
    uVar20 = 0xffffffff;
  }
  else {
    bVar8 = *Format;
    pbVar23 = __nptr;
    while (iVar10 = isdigit((uint)bVar8), iVar10 != 0) {
      bVar8 = *Format;
      *pbVar23 = bVar8;
      if ((pbVar21 < &local_438) || (TempBuff + 0x3f8 <= pbVar21)) goto LAB_003144bb;
      pbVar23 = pbVar23 + 1;
      *pbVar21 = bVar8;
      pbVar21 = pbVar21 + 1;
      bVar8 = ((byte *)Format)[1];
      Format = (LPCSTR)((byte *)Format + 1);
    }
    *pbVar23 = 0;
    uVar11 = atoi((char *)__nptr);
    if ((int)uVar11 < 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00314610;
      local_43c = 0xffffffff;
      DVar14 = 0x54f;
      iVar10 = n;
      goto LAB_00313c1d;
    }
    uVar20 = (ulong)uVar11;
  }
  iVar10 = n;
  bVar8 = *Format;
  if (0x6b < bVar8) {
    if (bVar8 == 0x6c) {
LAB_00313a96:
      bVar8 = ((byte *)Format)[1];
      pbVar23 = (byte *)Format + 1;
      Format = (LPCSTR)((byte *)Format + 2);
      if (bVar8 != 0x6c) {
        Format = (LPCSTR)pbVar23;
      }
      uVar13 = -(uint)((bVar8 + 0x9d & 0xef) != 0) | 2;
      if (bVar8 == 0x6c) {
        uVar13 = 3;
      }
      goto LAB_00313b16;
    }
    if (bVar8 != 0x70) {
      if (bVar8 != 0x77) goto LAB_00313b19;
      goto LAB_00313a96;
    }
LAB_00313bb5:
    if (pbVar21 < &local_438 || TempBuff + 0x3f8 <= pbVar21) goto LAB_00313e4f;
    eVar12 = strcpy_s((char *)pbVar21,(long)(TempBuff + 0x3f8) - (long)pbVar21,"ll");
    if (eVar12 == 0) {
      sVar15 = strlen("ll");
      pbVar21 = pbVar21 + sVar15;
      uVar13 = 3;
      goto LAB_00313d6d;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00314610;
    local_43c = 3;
    DVar14 = 0x7a;
    iVar10 = n;
    goto LAB_00313c1d;
  }
  if (bVar8 == 0x49) {
    uVar13 = 0xffffffff;
    if (((byte *)Format)[1] == 0x36) {
      pbVar23 = (byte *)Format + 2;
      Format = (LPCSTR)((byte *)Format + (ulong)(*pbVar23 == 0x34) * 3);
      uVar13 = (uint)(*pbVar23 == 0x34) * 4 - 1;
    }
LAB_00313b16:
    bVar8 = *Format;
  }
  else {
    if (bVar8 == 0x4c) {
      Format = (LPCSTR)((byte *)Format + 1);
      uVar13 = 0xffffffff;
      goto LAB_00313b16;
    }
    if (bVar8 == 0x68) {
      Format = (LPCSTR)((byte *)Format + 1);
      uVar13 = 1;
      goto LAB_00313b16;
    }
  }
LAB_00313b19:
  uVar11 = (uint)bVar8;
  bVar3 = true;
  local_43c = 0xffffffff;
  if (uVar11 < 0x47) {
    if (uVar11 == 0x20) {
      local_43c = 7;
    }
    else {
      if (uVar11 == 0x43) goto switchD_00313b4b_caseD_63;
      if (uVar11 == 0x45) goto switchD_00313b4b_caseD_65;
    }
    goto switchD_00313b4b_caseD_59;
  }
  switch(uVar11) {
  case 0x58:
  case 100:
  case 0x69:
  case 0x6f:
  case 0x70:
  case 0x75:
  case 0x78:
    if (uVar13 == 3) goto LAB_00313bb5;
    if (uVar13 == 2) {
      if (&local_438 <= pbVar21 && pbVar21 < TempBuff + 0x3f8) {
        *pbVar21 = 0x6c;
        uVar13 = 2;
LAB_00313cf2:
        pbVar21 = pbVar21 + 1;
        goto LAB_00313d6d;
      }
LAB_00313e4f:
      SetLastError(0x7a);
      local_43c = 3;
      iVar10 = n;
      break;
    }
    if (uVar13 == 1) {
      if (&local_438 <= pbVar21 && pbVar21 < TempBuff + 0x3f8) {
        *pbVar21 = 0x68;
        uVar13 = 1;
        goto LAB_00313cf2;
      }
      goto LAB_00313e4f;
    }
LAB_00313d6d:
    if (pbVar21 < &local_438 || TempBuff + 0x3f8 <= pbVar21) goto LAB_00313e4f;
    bVar8 = *Format;
    Format = (LPCSTR)((byte *)Format + 1);
    *pbVar21 = bVar8;
    pbVar21 = pbVar21 + 1;
    local_43c = 3;
LAB_00313d98:
    bVar6 = false;
    goto LAB_00313d9b;
  case 0x59:
  case 0x5a:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    goto switchD_00313b4b_caseD_59;
  case 0x5b:
    if (pbVar21 < &local_438 || TempBuff + 0x3f8 <= pbVar21) {
LAB_003144bb:
      SetLastError(0x7a);
      local_43c = 0xffffffff;
      iVar10 = n;
    }
    else {
      pbVar23 = pbVar21 + 1;
      *pbVar21 = 0x5b;
      bVar8 = ((byte *)Format)[1];
      pbVar7 = (byte *)Format + 1;
      if (bVar8 == 0x5e) {
        if (pbVar23 < &local_438 || TempBuff + 0x3f8 <= pbVar23) {
          SetLastError(0x7a);
          local_43c = 0xffffffff;
          Format = (LPCSTR)((byte *)Format + 1);
          iVar10 = n;
          break;
        }
        pbVar21[1] = 0x5e;
        pbVar23 = pbVar21 + 2;
        bVar8 = ((byte *)Format)[2];
        pbVar7 = (byte *)Format + 2;
      }
      Format = (LPCSTR)pbVar7;
      if (bVar8 == 0x5d) {
        if (&local_438 <= pbVar23 && pbVar23 < TempBuff + 0x3f8) {
          *pbVar23 = 0x5d;
          pbVar23 = pbVar23 + 1;
          bVar8 = ((byte *)Format)[1];
          Format = (LPCSTR)((byte *)Format + 1);
          goto LAB_00314184;
        }
      }
      else {
LAB_00314184:
        if (bVar8 != 0x2d) {
LAB_003141b8:
          do {
            bVar8 = *Format;
            if (bVar8 == 0x2d) {
              bVar8 = ((byte *)Format)[1];
              if (bVar8 == 0x5d) {
                if ((&local_438 <= pbVar23) && (pbVar23 < TempBuff + 0x3f8)) {
                  *pbVar23 = 0x2d;
                  goto LAB_0031421c;
                }
                goto LAB_003144bb;
              }
              bVar1 = ((byte *)Format)[-1];
              if (bVar8 < bVar1) {
                pbVar21 = pbVar23 + -1;
                if ((pbVar21 < &local_438) || (TempBuff + 0x3f8 <= pbVar21)) goto LAB_003144bb;
                *pbVar21 = bVar8;
                bVar8 = bVar1;
              }
              if ((pbVar23 < &local_438) || (TempBuff + 0x3f8 <= pbVar23)) goto LAB_003144bb;
              *pbVar23 = 0x2d;
              if ((pbVar23 + 1 < &local_438) || (TempBuff + 0x3f8 <= pbVar23 + 1))
              goto LAB_003144bb;
              pbVar23[1] = bVar8;
              pbVar23 = pbVar23 + 2;
              lVar16 = 2;
            }
            else {
              if (bVar8 == 0) {
                local_43c = 6;
                bVar6 = false;
                bVar4 = false;
                bVar8 = 0;
                bVar5 = false;
                bVar3 = false;
                pbVar21 = pbVar23;
                goto LAB_00313daa;
              }
              if (bVar8 == 0x5d) {
                if (&local_438 <= pbVar23 && pbVar23 < TempBuff + 0x3f8) {
                  *pbVar23 = 0x5d;
                  pbVar21 = pbVar23 + 1;
                  Format = (LPCSTR)((byte *)Format + 1);
                  local_43c = 6;
                  goto LAB_00313d98;
                }
                goto LAB_003144bb;
              }
              if ((pbVar23 < &local_438) || (TempBuff + 0x3f8 <= pbVar23)) goto LAB_003144bb;
              *pbVar23 = bVar8;
LAB_0031421c:
              pbVar23 = pbVar23 + 1;
              lVar16 = 1;
            }
            Format = (LPCSTR)((byte *)Format + lVar16);
          } while( true );
        }
        if (&local_438 <= pbVar23 && pbVar23 < TempBuff + 0x3f8) {
          *pbVar23 = 0x2d;
          pbVar23 = pbVar23 + 1;
          Format = (LPCSTR)((byte *)Format + 1);
          goto LAB_003141b8;
        }
      }
      SetLastError(0x7a);
      local_43c = 0xffffffff;
    }
    break;
  case 99:
switchD_00313b4b_caseD_63:
    if (uVar13 != 1) {
      if ((bVar8 != 0x43) && (uVar13 != 2)) goto LAB_00313d14;
      if (&local_438 <= pbVar21 && pbVar21 < TempBuff + 0x3f8) {
        *pbVar21 = 0x6c;
        pbVar21 = pbVar21 + 1;
        uVar13 = 2;
        goto LAB_00313d14;
      }
LAB_00313fc4:
      SetLastError(0x7a);
      local_43c = 1;
      iVar10 = n;
      break;
    }
    uVar13 = 1;
LAB_00313d14:
    if (pbVar21 < &local_438 || TempBuff + 0x3f8 <= pbVar21) goto LAB_00313fc4;
    *pbVar21 = 99;
    pbVar21 = pbVar21 + 1;
    Format = (LPCSTR)((byte *)Format + 1);
    local_43c = 1;
    bVar4 = true;
    bVar6 = false;
    bVar8 = 1;
    goto LAB_00313da1;
  case 0x65:
  case 0x66:
  case 0x67:
switchD_00313b4b_caseD_65:
    if (&local_438 <= pbVar21 && pbVar21 < TempBuff + 0x3f8) {
      Format = (LPCSTR)((byte *)Format + 1);
      iVar10 = tolower(uVar11);
      *pbVar21 = (byte)iVar10;
      pbVar21 = pbVar21 + 1;
      local_43c = 5;
      goto LAB_00313d98;
    }
    SetLastError(0x7a);
    local_43c = 5;
    iVar10 = n;
    break;
  case 0x6e:
    if (uVar13 == 1) {
      if (pbVar21 < &local_438 || TempBuff + 0x3f8 <= pbVar21) goto LAB_003144bb;
      *pbVar21 = 0x68;
      pbVar21 = pbVar21 + 1;
    }
    if (pbVar21 < &local_438 || TempBuff + 0x3f8 <= pbVar21) goto LAB_003144bb;
    bVar8 = *Format;
    Format = (LPCSTR)((byte *)Format + 1);
    *pbVar21 = bVar8;
    pbVar21 = pbVar21 + 1;
    local_43c = 4;
    bVar6 = true;
LAB_00313d9b:
    bVar4 = false;
    bVar8 = 0;
LAB_00313da1:
    bVar5 = false;
LAB_00313da3:
    bVar3 = false;
LAB_00313daa:
    pbVar23 = (byte *)(TempBuff + 0x3f8);
    if ((pbVar21 < &local_438 || pbVar23 <= pbVar21) ||
       (*pbVar21 = 0x25, pbVar21 + 1 < &local_438 || pbVar23 <= pbVar21 + 1)) {
LAB_00313e40:
      SetLastError(0x7a);
      iVar10 = n;
      break;
    }
    pbVar21[1] = 0x6e;
    pbVar21 = pbVar21 + 2;
    if (pbVar21 < &local_438 || pbVar23 <= pbVar21) goto LAB_00313e40;
    *pbVar21 = 0;
    PAL_free(__nptr);
    iVar10 = n;
    if (bVar3) goto LAB_003144e6;
    local_468 = (int)Buffer;
    iVar9 = (int)uVar20;
    if (uVar13 == 2) {
      if (bVar4) {
        bVar8 = iVar9 == -1 & bVar8;
        if (bVar8 != 0) {
          uVar20 = 1;
        }
        uVar18 = (ulong)bVar8;
        uVar13 = (uint)bVar8;
        uVar24 = uVar18;
        if (pbVar22[uVar18] != 0) {
          iVar19 = (int)uVar20;
          iVar9 = isspace((uint)pbVar22[uVar18]);
          if ((iVar9 == 0) && (iVar19 == -1 || (int)(uint)bVar8 < iVar19)) {
            while( true ) {
              uVar13 = uVar13 + 1;
              uVar18 = (ulong)uVar13;
              uVar24 = (ulong)(int)uVar13;
              if (pbVar22[uVar24] == 0) break;
              iVar9 = isspace((uint)pbVar22[uVar24]);
              iVar10 = n;
              if ((iVar9 != 0) || (iVar19 != -1 && iVar19 <= (int)uVar13)) break;
            }
          }
        }
        pbVar23 = pbVar22 + uVar24;
        if (local_441 == 0x2a) goto LAB_00314509;
        uVar13 = ap->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          puVar17 = (undefined8 *)((ulong)uVar13 + (long)ap->reg_save_area);
          ap->gp_offset = uVar13 + 8;
        }
        else {
          puVar17 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar17 + 1;
        }
        lpWideCharStr = (LPWSTR)*puVar17;
        iVar10 = MultiByteToWideChar(0,0,(LPCSTR)pbVar22,(int)uVar18,lpWideCharStr,(int)uVar18);
        if (iVar10 == 0) {
          fprintf(_stderr,"] %s %s:%d","PAL_vsscanf",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printf.cpp"
                  ,0x484);
          __stream = _stderr;
          DVar14 = GetLastError();
          fprintf(__stream,"MultiByteToWideChar failed.  Error is %d\n",(ulong)DVar14);
LAB_003145e6:
          iVar10 = -1;
          goto LAB_003145ec;
        }
        if (bVar5) {
          lpWideCharStr[iVar10] = L'\0';
        }
        iVar10 = n + 1;
      }
      else {
        if (!bVar6) goto LAB_003142ed;
LAB_003142c9:
        uVar13 = ap->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          puVar17 = (undefined8 *)((ulong)uVar13 + (long)ap->reg_save_area);
          ap->gp_offset = uVar13 + 8;
        }
        else {
          puVar17 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar17 + 1;
        }
        *(int *)*puVar17 = (int)pbVar22 - local_468;
LAB_0031453a:
        local_43c = 4;
        pbVar23 = pbVar22;
      }
    }
    else {
      if (bVar6) {
        if (uVar13 != 1) goto LAB_003142c9;
        uVar13 = ap->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          puVar17 = (undefined8 *)((ulong)uVar13 + (long)ap->reg_save_area);
          ap->gp_offset = uVar13 + 8;
        }
        else {
          puVar17 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar17 + 1;
        }
        *(short *)*puVar17 = (short)pbVar22 - (short)Buffer;
        goto LAB_0031453a;
      }
LAB_003142ed:
      if (local_441 == 0x2a) {
        iVar9 = sscanf_s((char *)pbVar22,(char *)&local_438,&local_448);
      }
      else {
        uVar13 = ap->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          puVar17 = (undefined8 *)((ulong)uVar13 + (long)ap->reg_save_area);
          ap->gp_offset = uVar13 + 8;
        }
        else {
          puVar17 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar17 + 1;
        }
        uVar2 = *puVar17;
        if ((local_43c & 0xfffffffb) == 2) {
          if (iVar9 < 1) {
            sVar15 = strlen(Buffer);
            iVar9 = (int)sVar15;
          }
          uVar20 = (ulong)(iVar9 + 1U);
          if (iVar9 + 1U != 0) {
LAB_00314426:
            iVar9 = sscanf_s((char *)pbVar22,(char *)&local_438,uVar2,uVar20,&local_448);
            goto LAB_00314453;
          }
        }
        else if (bVar8 != 0) {
          if (iVar9 < 2) {
            uVar20 = 1;
          }
          goto LAB_00314426;
        }
        iVar9 = sscanf_s((char *)pbVar22,(char *)&local_438,uVar2,&local_448);
      }
LAB_00314453:
      if (iVar9 < 1) goto LAB_003145ec;
      iVar10 = iVar10 + iVar9;
      pbVar23 = pbVar22 + local_448;
    }
    goto LAB_00314509;
  case 0x73:
switchD_00313b4b_caseD_73:
    if (uVar13 != 1) {
      if ((bVar8 != 0x53) && (uVar13 != 2)) goto LAB_00313f5a;
      if (&local_438 <= pbVar21 && pbVar21 < TempBuff + 0x3f8) {
        *pbVar21 = 0x6c;
        pbVar21 = pbVar21 + 1;
        uVar13 = 2;
        goto LAB_00313f5a;
      }
LAB_003140db:
      SetLastError(0x7a);
      local_43c = 2;
      iVar10 = n;
      break;
    }
    uVar13 = 1;
LAB_00313f5a:
    if (pbVar21 < &local_438 || TempBuff + 0x3f8 <= pbVar21) goto LAB_003140db;
    *pbVar21 = 0x73;
    pbVar21 = pbVar21 + 1;
    Format = (LPCSTR)((byte *)Format + 1);
    local_43c = 2;
    bVar4 = true;
    bVar6 = false;
    bVar8 = 0;
    bVar5 = true;
    goto LAB_00313da3;
  default:
    if (uVar11 == 0x47) goto switchD_00313b4b_caseD_65;
    if (uVar11 == 0x53) goto switchD_00313b4b_caseD_73;
    goto switchD_00313b4b_caseD_59;
  }
  if (PAL_InitializeChakraCoreCalled == false) {
LAB_00314610:
    abort();
  }
LAB_003144e6:
  if ((*Format != *pbVar22) || (local_43c == 7)) goto LAB_003145ec;
  Format = (LPCSTR)((byte *)Format + 1);
  pbVar23 = pbVar22 + 1;
LAB_00314509:
  pbVar22 = pbVar23;
  bVar8 = *Format;
  if (bVar8 == 0) goto LAB_003145ec;
  goto LAB_003138f8;
switchD_00313b4b_caseD_59:
  bVar6 = false;
  bVar4 = false;
  bVar8 = 0;
  bVar5 = false;
  goto LAB_00313daa;
}

Assistant:

__attribute__((no_instrument_function))
int PAL_vsscanf(LPCSTR Buffer, LPCSTR Format, va_list ap)
{
    INT Length = 0;
    LPCSTR Buff = Buffer;
    LPCSTR Fmt = Format;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    BOOL Store;
    INT Width;
    INT Prefix;
    INT Type = -1;

    while (*Fmt)
    {
        if (!*Buff && Length == 0)
        {
            Length = EOF;
            break;
        }
        /* remove any number of blanks */
        else if (isspace((unsigned char) *Fmt))
        {
            while (isspace((unsigned char) *Buff))
            {
                ++Buff;
            }
            ++Fmt;
        }
        else if (*Fmt == '%' &&
                 Internal_ScanfExtractFormatA(&Fmt, TempBuff, sizeof(TempBuff), &Store,
                                              &Width, &Prefix, &Type))
        {
            if (Prefix == SCANF_PREFIX_LONG &&
                (Type == SCANF_TYPE_STRING || Type == SCANF_TYPE_CHAR))
            {
                int len = 0;
                int res;
                WCHAR *charPtr = 0;

                /* a single character */
                if (Type == SCANF_TYPE_CHAR && Width == -1)
                {
                    len = Width = 1;
                }

                /* calculate length of string to copy */
                while (Buff[len] && !isspace((unsigned char) Buff[len]))
                {
                    if (Width != -1 && len >= Width)
                    {
                        break;
                    }
                    ++len;
                }

                if (Store)
                {
                    charPtr = va_arg(ap, WCHAR *);

                    res = MultiByteToWideChar(CP_ACP, 0, Buff, len,
                                            charPtr, len);
                    if (!res)
                    {
                        ASSERT("MultiByteToWideChar failed.  Error is %d\n",
                            GetLastError());
                        return -1;
                    }
                    if (Type == SCANF_TYPE_STRING)
                    {
                        /* end string */
                        charPtr[res] = 0;
                    }
                    ++Length;
                }
                Buff += len;
            }
            /* this places the number of bytes stored into the next arg */
            else if (Type == SCANF_TYPE_N)
            {
                if (Prefix == SCANF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = Buff - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = Buff - Buffer;
                }
            }
            /* types that sscanf can handle */
            else
            {
                int ret;
                int n;
                LPVOID voidPtr = NULL;

                if (Store)
                {
                    // sscanf_s requires that if we are trying to read "%s" or "%c" or "%[", then
                    // the size of the buffer must follow the buffer we are trying to read into.
                    voidPtr = va_arg(ap, LPVOID);
                    unsigned typeLen = 0;
                    if ((Type == SCANF_TYPE_STRING) || (Type == SCANF_TYPE_BRACKETS))
                    {
                        // Since this is not a Safe CRT API we don't really know the size of the destination
                        // buffer provided by the caller. So we have to assume that the caller has allocated
                        // enough space to hold either the width specified in the format or the entire input
                        // string plus '\0'.
                        typeLen = ((Width > 0) ? Width : strlen(Buffer)) + 1;
                    }
                    else if (Type == SCANF_TYPE_CHAR)
                    {
                        // Check whether the format string contains number of characters
                        // that should be read from the input string.
                        // Note: '\0' does not get appended in the "%c" case.
                        typeLen = (Width > 0) ? Width : 1;
                    }

                    if (typeLen > 0)
                    {
                        ret = sscanf_s(Buff, TempBuff, voidPtr, typeLen, &n);
                    }
                    else
                    {
                        ret = sscanf_s(Buff, TempBuff, voidPtr, &n);
                    }
                }
                else
                {
                    ret = sscanf_s(Buff, TempBuff, &n);
                }

#if SSCANF_CANNOT_HANDLE_MISSING_EXPONENT
                if ((ret == 0) && (Type == SCANF_TYPE_FLOAT))
                {
                    ret = SscanfFloatCheckExponent(Buff, TempBuff, voidPtr, &n);
                }
#endif // SSCANF_CANNOT_HANDLE_MISSING_EXPONENT

                if (ret > 0)
                {
                    Length += ret;
                }
                else
                {
                    /* no match, break scan */
                    break;
                }
                Buff += n;
            }
        }
        else
        {
            /* grab, but not store */
            if (*Fmt == *Buff && Type != SCANF_TYPE_SPACE)
            {
                ++Fmt;
                ++Buff;
            }
            /* doesn't match, break scan */
            else
            {
                break;
            }
        }
    }

    return Length;
}